

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O1

ImportSourcePtr __thiscall libcellml::Importer::importSource(Importer *this,size_t index)

{
  pointer puVar1;
  LoggerImpl *pLVar2;
  undefined8 uVar3;
  ulong in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  ImportSourcePtr IVar5;
  
  (this->super_Logger)._vptr_Logger = (_func_int **)0x0;
  (this->super_Logger).mPimpl = (LoggerImpl *)0x0;
  pLVar2 = Logger::pFunc((Logger *)index);
  _Var4._M_pi = extraout_RDX;
  if (in_RDX < (ulong)((long)pLVar2[1].mMessages.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage -
                       (long)pLVar2[1].mMessages.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish >> 4)) {
    pLVar2 = Logger::pFunc((Logger *)index);
    puVar1 = pLVar2[1].mMessages.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)pLVar2[1].mMessages.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage - (long)puVar1 >> 4) <= in_RDX) {
      uVar3 = std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                        );
      pLVar2 = (this->super_Logger).mPimpl;
      if (pLVar2 != (LoggerImpl *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pLVar2);
      }
      _Unwind_Resume(uVar3);
    }
    puVar1 = puVar1 + in_RDX * 2;
    (this->super_Logger)._vptr_Logger = (_func_int **)*puVar1;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(this->super_Logger).mPimpl,
               (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(puVar1 + 1));
    _Var4._M_pi = extraout_RDX_00;
  }
  IVar5.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  IVar5.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ImportSourcePtr)
         IVar5.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ImportSourcePtr Importer::importSource(size_t index) const
{
    ImportSourcePtr importSrc = nullptr;
    if (index < pFunc()->mImports.size()) {
        importSrc = pFunc()->mImports.at(index);
    }

    return importSrc;
}